

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

void output_requires(string *section,string *version,
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *s)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  long lVar3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  string m2;
  long *local_58;
  long local_50;
  long local_48 [2];
  string *local_38;
  
  p_Var2 = (s->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(s->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    bVar5 = true;
    local_38 = section;
    do {
      if (bVar5) {
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(local_38->_M_dataplus)._M_p,
                            local_38->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
        bVar5 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      }
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,*(long *)(p_Var2 + 1),
                 (long)&(p_Var2[1]._M_parent)->_M_color + *(long *)(p_Var2 + 1));
      if (local_50 != 0) {
        lVar3 = 0;
        do {
          if (*(char *)((long)local_58 + lVar3) == '~') {
            *(undefined1 *)((long)local_58 + lVar3) = 0x5f;
          }
          lVar3 = lVar3 + 1;
        } while (local_50 != lVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"boost_",6);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(version->_M_dataplus)._M_p,version->_M_string_length);
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  return;
}

Assistant:

static void output_requires( std::string const & section, std::string const & version, std::set< std::string > const & s )
{
    bool first = true;

    for( std::set< std::string >::const_iterator i = s.begin(); i != s.end(); ++i )
    {
        if( first )
        {
            std::cout << section << ": ";
            first = false;
        }
        else
        {
            std::cout << ", ";
        }

        std::string m2( *i );
        std::replace( m2.begin(), m2.end(), '~', '_' );

        std::cout << "boost_" << m2 << " = " << version;
    }
}